

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spline.cpp
# Opt level: O0

UnitBoundedPolynomial1<5U> *
UnitBoundedPolynomial1<5U>::fit(Matrix<double,_3,_1,_0,_3,_1> *a,Matrix<double,_3,_1,_0,_3,_1> *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  CoeffReturnType pdVar5;
  UnitBoundedPolynomial1<5U> *in_RDI;
  double index;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *this;
  double dVar6;
  UnitBoundedPolynomial1<5U> *out;
  Index in_stack_ffffffffffffff68;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_ffffffffffffff70;
  
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  in_RDI->coeffs[0] = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  in_RDI->coeffs[1] = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  in_RDI->coeffs[2] = *pdVar5 * 0.5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  dVar6 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  index = *pdVar5 * -1.5 + dVar6 * -10.0 + -(dVar1 * 6.0);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_ffffffffffffff70,(Index)index);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)(*pdVar5 * 10.0 + index);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar6 = *pdVar5 * -4.0 + (double)this;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  in_RDI->coeffs[3] = *pdVar5 * 0.5 + dVar6;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar6 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar4 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  in_RDI->coeffs[4] =
       (dVar4 * 7.0 + dVar3 * -15.0 + dVar2 * 1.5 + dVar6 * 15.0 + dVar1 * 8.0) - *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar6 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar3 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  dVar4 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (this,(Index)index);
  in_RDI->coeffs[5] =
       *pdVar5 * 0.5 + dVar4 * -3.0 + dVar3 * 6.0 + dVar2 * -0.5 + dVar6 * -6.0 + -(dVar1 * 3.0);
  return in_RDI;
}

Assistant:

UnitBoundedPolynomial1<5> UnitBoundedPolynomial1<5>::fit(const Matrix<double, RequiredValues, 1> a, 
                                                         const Matrix<double, RequiredValues, 1> b)
{
    UnitBoundedPolynomial1<5> out;
    out.coeffs[0] = a[0];
    out.coeffs[1] = a[1];
    out.coeffs[2] = 0.5 * a[2];
    out.coeffs[3] = -10 * a[0] - 6 * a[1] - 1.5 * a[2] + 10 * b[0] - 4 * b[1] + 0.5 * b[2];
    out.coeffs[4] =  15 * a[0] + 8 * a[1] + 1.5 * a[2] - 15 * b[0] + 7 * b[1] - 1.0 * b[2];
    out.coeffs[5] = - 6 * a[0] - 3 * a[1] - 0.5 * a[2] +  6 * b[0] - 3 * b[1] + 0.5 * b[2];

    return out;
}